

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyT<int>::PropertyT(PropertyT<int> *this,PropertyT<int> *_rhs)

{
  PropertyT<int> *_rhs_local;
  PropertyT<int> *this_local;
  
  BaseProperty::BaseProperty(&this->super_BaseProperty,&_rhs->super_BaseProperty);
  (this->super_BaseProperty)._vptr_BaseProperty = (_func_int **)&PTR__PropertyT_003de470;
  std::vector<int,_std::allocator<int>_>::vector(&this->data_,&_rhs->data_);
  return;
}

Assistant:

PropertyT(const PropertyT & _rhs)
      : BaseProperty( _rhs ), data_( _rhs.data_ ) {}